

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall GlobOpt::CollectMemcopyStElementI(GlobOpt *this,Instr *instr,Loop *loop)

{
  MemOpList *pMVar1;
  Opnd *pOVar2;
  RegOpnd *baseOpnd;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  undefined4 *puVar10;
  StackSym *pSVar11;
  JITTimeFunctionBody *pJVar12;
  FunctionJITTimeInfo *pFVar13;
  char16 *pcVar14;
  char16 *pcVar15;
  Type *ppMVar16;
  MemCopyCandidate *pMVar17;
  GlobOpt *this_00;
  InductionVariable *pIVar18;
  char16_t *form;
  GlobOpt *this_01;
  SymID SVar19;
  SymID SVar20;
  SymID SVar21;
  wchar local_a8 [4];
  char16 debugStringBuffer [42];
  SymID inductionSymID;
  
  if ((loop->memOpInfo == (MemOpInfo *)0x0) ||
     (pMVar1 = loop->memOpInfo->candidates,
     (MemOpList *)
     (pMVar1->super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>).
     super_SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>.
     super_SListNodeBase<Memory::ArenaAllocator>.next == pMVar1)) {
    return false;
  }
  OVar4 = IR::Opnd::GetKind(instr->m_dst);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x81a,"(instr->GetDst()->IsIndirOpnd())","instr->GetDst()->IsIndirOpnd()");
    if (!bVar5) goto LAB_004465ea;
    *puVar10 = 0;
  }
  pOVar2 = instr->m_dst;
  OVar4 = IR::Opnd::GetKind(pOVar2);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar5) goto LAB_004465ea;
    *puVar10 = 0;
  }
  baseOpnd = (RegOpnd *)pOVar2[1]._vptr_Opnd;
  this_01 = *(GlobOpt **)&pOVar2[1].m_valueType;
  OVar4 = IR::Opnd::GetKind((Opnd *)baseOpnd);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_004465ea;
    *puVar10 = 0;
  }
  pSVar11 = IR::Opnd::GetStackSym((Opnd *)baseOpnd);
  SVar20 = 0xffffffff;
  if ((pSVar11 != (StackSym *)0x0) &&
     ((pSVar11->m_type == TyVar ||
      (pSVar11 = StackSym::GetVarEquivSym(pSVar11,(Func *)0x0), pSVar11 != (StackSym *)0x0)))) {
    SVar20 = (pSVar11->super_Sym).m_id;
  }
  OVar4 = IR::Opnd::GetKind(instr->m_src1);
  if (OVar4 != OpndKindReg) {
    return false;
  }
  pOVar2 = instr->m_src1;
  OVar4 = IR::Opnd::GetKind(pOVar2);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_004465ea;
    *puVar10 = 0;
  }
  if ((pOVar2->field_0xb & 4) == 0) {
    if (DAT_015bc46a != '\x01') {
      return false;
    }
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemOpPhase,uVar8,uVar9);
    if (!bVar5) {
      pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
      pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemCopyPhase,uVar8,uVar9);
      if (!bVar5) {
        return false;
      }
    }
    Output::Print(L"TRACE MemCopy:");
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar13,(wchar (*) [42])local_a8);
    uVar8 = Loop::GetLoopNumber(loop);
    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar14,pcVar15,(ulong)uVar8);
    form = L"Source (s%d) is still alive after StElemI";
  }
  else {
    bVar5 = IsAllowedForMemOpt(this,instr,false,baseOpnd,(Opnd *)this_01);
    if (!bVar5) {
      return false;
    }
    pSVar11 = IR::Opnd::GetStackSym(pOVar2);
    SVar21 = 0xffffffff;
    if ((pSVar11 != (StackSym *)0x0) &&
       ((pSVar11->m_type == TyVar ||
        (pSVar11 = StackSym::GetVarEquivSym(pSVar11,(Func *)0x0), pSVar11 != (StackSym *)0x0)))) {
      SVar21 = (pSVar11->super_Sym).m_id;
    }
    ppMVar16 = SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Head
                         ((SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)
                          loop->memOpInfo->candidates);
    if ((*ppMVar16)->type != MEMCOPY) {
      return false;
    }
    pMVar17 = Loop::MemOpCandidate::AsMemCopy(*ppMVar16);
    if ((pMVar17->super_MemOpCandidate).base == 0xffffffff) {
      pSVar11 = pMVar17->transferSym;
      SVar19 = 0xffffffff;
      if ((pSVar11 != (StackSym *)0x0) &&
         ((pSVar11->m_type == TyVar ||
          (unique0x10000bc6 = pMVar17, pSVar11 = StackSym::GetVarEquivSym(pSVar11,(Func *)0x0),
          pMVar17 = stack0xffffffffffffffb0, pSVar11 != (StackSym *)0x0)))) {
        SVar19 = (pSVar11->super_Sym).m_id;
      }
      if (SVar19 == SVar21) {
        unique0x10000bce = pMVar17;
        pSVar11 = IR::Opnd::GetStackSym((Opnd *)this_01);
        if (pSVar11 == (StackSym *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x847,"(indexOp->GetStackSym())","indexOp->GetStackSym()");
          if (!bVar5) goto LAB_004465ea;
          *puVar10 = 0;
        }
        this_00 = (GlobOpt *)IR::Opnd::GetStackSym((Opnd *)this_01);
        debugStringBuffer._76_4_ = 0xffffffff;
        if ((this_00 != (GlobOpt *)0x0) &&
           ((*(IRType *)((long)&this_00->intConstantToValueMap + 4) == TyVar ||
            (this_01 = this_00,
            this_00 = (GlobOpt *)StackSym::GetVarEquivSym((StackSym *)this_00,(Func *)0x0),
            this_00 != (GlobOpt *)0x0)))) {
          debugStringBuffer._76_4_ = *(undefined4 *)&this_00->intConstantToStackSymMap;
        }
        pIVar18 = GetInductionVariable(this_01,debugStringBuffer._76_4_,loop);
        if (pIVar18 == (InductionVariable *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x849,"(IsSymIDInductionVariable(inductionSymID, loop))",
                             "IsSymIDInductionVariable(inductionSymID, loop)");
          if (!bVar5) goto LAB_004465ea;
          *puVar10 = 0;
        }
        bVar5 = JsUtil::
                BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::ContainsKey(loop->memOpInfo->inductionVariableChangeInfoMap,
                              (uint *)(debugStringBuffer + 0x26));
        bVar5 = (stack0xffffffffffffffb0->super_MemOpCandidate).bIndexAlreadyChanged == bVar5;
        if (bVar5) {
          bVar6 = (stack0xffffffffffffffb0->super_MemOpCandidate).count + 1;
          (stack0xffffffffffffffb0->super_MemOpCandidate).count = bVar6;
          if (1 < bVar6) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar10 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x854,"(memcopyInfo->count <= 1)","memcopyInfo->count <= 1");
            if (!bVar7) {
LAB_004465ea:
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar10 = 0;
          }
          (register0x00000008->super_MemOpCandidate).base = SVar20;
          return bVar5;
        }
        if (DAT_015bc46a != '\x01') {
          return bVar5;
        }
        pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
        pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
        bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemOpPhase,uVar8,uVar9);
        if (!bVar7) {
          pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
          uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
          pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
          uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
          bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemCopyPhase,uVar8,uVar9);
          if (!bVar7) {
            return bVar5;
          }
        }
        Output::Print(L"TRACE MemCopy:");
        pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
        pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar13,(wchar (*) [42])local_a8);
        uVar8 = Loop::GetLoopNumber(loop);
        Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar14,pcVar15,(ulong)uVar8);
        Output::Print(L"Index value changed between ldElem and stElem");
        goto LAB_004460c5;
      }
    }
    if (DAT_015bc46a != '\x01') {
      return false;
    }
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemOpPhase,uVar8,uVar9);
    if (!bVar5) {
      pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
      pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemCopyPhase,uVar8,uVar9);
      if (!bVar5) {
        return false;
      }
    }
    Output::Print(L"TRACE MemCopy:");
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar13,(wchar (*) [42])local_a8);
    uVar8 = Loop::GetLoopNumber(loop);
    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar14,pcVar15,(ulong)uVar8);
    form = L"No matching LdElem found (s%d)";
  }
  bVar5 = false;
  Output::Print(form,(ulong)SVar20);
LAB_004460c5:
  IR::Instr::DumpByteCodeOffset(instr);
  pcVar14 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
  Output::Print(L" (%s)",pcVar14);
  Output::Print(L"\n");
  Output::Flush();
  return bVar5;
}

Assistant:

bool GlobOpt::CollectMemcopyStElementI(IR::Instr *instr, Loop *loop)
{
    if (!loop->memOpInfo || loop->memOpInfo->candidates->Empty())
    {
        // There is no ldElem matching this stElem
        return false;
    }

    Assert(instr->GetDst()->IsIndirOpnd());
    IR::IndirOpnd *dst = instr->GetDst()->AsIndirOpnd();
    IR::Opnd *indexOp = dst->GetIndexOpnd();
    IR::RegOpnd *baseOp = dst->GetBaseOpnd()->AsRegOpnd();
    SymID baseSymID = GetVarSymID(baseOp->GetStackSym());

    if (!instr->GetSrc1()->IsRegOpnd())
    {
        return false;
    }
    IR::RegOpnd* src1 = instr->GetSrc1()->AsRegOpnd();

    if (!src1->GetIsDead())
    {
        // This must be the last use of the register.
        // It will invalidate `var m = a[i]; b[i] = m;` but this is not a very interesting case.
        TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("Source (s%d) is still alive after StElemI"), baseSymID);
        return false;
    }

    if (!IsAllowedForMemOpt(instr, false, baseOp, indexOp))
    {
        return false;
    }

    SymID srcSymID = GetVarSymID(src1->GetStackSym());

    // Prepare the memcopyCandidate entry
    Loop::MemOpCandidate* previousCandidate = loop->memOpInfo->candidates->Head();
    if (!previousCandidate->IsMemCopy())
    {
        return false;
    }
    Loop::MemCopyCandidate* memcopyInfo = previousCandidate->AsMemCopy();

    // The previous candidate has to have been created by the matching ldElem
    if (
        memcopyInfo->base != Js::Constants::InvalidSymID ||
        GetVarSymID(memcopyInfo->transferSym) != srcSymID
    )
    {
        TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("No matching LdElem found (s%d)"), baseSymID);
        return false;
    }

    Assert(indexOp->GetStackSym());
    SymID inductionSymID = GetVarSymID(indexOp->GetStackSym());
    Assert(IsSymIDInductionVariable(inductionSymID, loop));
    bool isIndexPreIncr = loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(inductionSymID);
    if (isIndexPreIncr != memcopyInfo->bIndexAlreadyChanged)
    {
        // The index changed between the load and the store
        TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("Index value changed between ldElem and stElem"));
        return false;
    }

    // Consider: Can we remove the count field?
    memcopyInfo->count++;
    AssertOrFailFast(memcopyInfo->count <= 1);
    memcopyInfo->base = baseSymID;

    return true;
}